

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

int pfl_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  PlugVtable *pPVar1;
  undefined8 *puVar2;
  Socket *s;
  char *pcVar3;
  strbuf *psVar4;
  SshChannel *pSVar5;
  int iVar6;
  
  pPVar1 = p[-5].vt;
  puVar2 = (undefined8 *)safemalloc(1,0x58,0);
  puVar2[6] = 0;
  puVar2[8] = &PortForwarding_plugvt;
  *(undefined4 *)(puVar2 + 10) = 0;
  puVar2[9] = &PortForwarding_channelvt;
  *puVar2 = 0;
  puVar2[1] = pPVar1;
  *(undefined2 *)(puVar2 + 3) = 1;
  *(undefined8 *)((long)puVar2 + 0x1c) = 0;
  *(undefined8 *)((long)puVar2 + 0x24) = 0;
  s = (*constructor)((accept_ctx_t)ctx.p,(Plug *)(puVar2 + 8));
  pcVar3 = (*s->vt->socket_error)(s);
  if (pcVar3 == (char *)0x0) {
    if (*(char *)&p[-3].vt == '\x01') {
      puVar2[2] = s;
      *(undefined4 *)((long)puVar2 + 0x1c) = 1;
      psVar4 = strbuf_new();
      puVar2[6] = psVar4;
      puVar2[7] = 0;
      *(undefined4 *)(puVar2 + 5) = 0;
      iVar6 = 0;
      (*s->vt->set_frozen)(s,false);
    }
    else {
      pcVar3 = dupstr((char *)p[-2].vt);
      puVar2[4] = pcVar3;
      iVar6 = *(int *)&p[-1].vt;
      *(int *)(puVar2 + 5) = iVar6;
      pSVar5 = wrap_lportfwd_open((ConnectionLayer *)p[-5].vt,pcVar3,iVar6,s,(Channel *)(puVar2 + 9)
                                 );
      if ((ChannelVtable *)puVar2[9] != &PortForwarding_channelvt) {
        __assert_fail("pfchan->vt == &PortForwarding_channelvt",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                      ,0x1fd,"void portfwd_raw_setup(Channel *, Socket *, SshChannel *)");
      }
      puVar2[2] = s;
      *puVar2 = pSVar5;
      iVar6 = 0;
    }
  }
  else {
    portfwd_raw_free((Channel *)(puVar2 + 9));
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int pfl_accepting(Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    struct PortListener *pl = container_of(p, struct PortListener, plug);
    struct PortForwarding *pf;
    Channel *chan;
    Plug *plug;
    Socket *s;
    const char *err;

    chan = portfwd_raw_new(pl->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }

    pf = container_of(chan, struct PortForwarding, chan);

    if (pl->is_dynamic) {
        pf->s = s;
        pf->socks_state = SOCKS_INITIAL;
        pf->socksbuf = strbuf_new();
        pf->socksbuf_consumed = 0;
        pf->port = 0;                  /* "hostname" buffer is so far empty */
        sk_set_frozen(s, false);       /* we want to receive SOCKS _now_! */
    } else {
        pf->hostname = dupstr(pl->hostname);
        pf->port = pl->port;
        portfwd_raw_setup(
            chan, s,
            wrap_lportfwd_open(pl->cl, pf->hostname, pf->port, s, &pf->chan));
    }

    return 0;
}